

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O0

void __thiscall
tchecker::
make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
::take_reference(make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
                 *this)

{
  refcount_t *prVar1;
  overflow_error *this_00;
  refcount_t *refcount;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::zg::path::concrete::node_t,_tchecker::zg::path::concrete::edge_t>,_unsigned_long,_1UL>
  *this_local;
  
  prVar1 = refcount_addr(this);
  *prVar1 = *prVar1 + 1;
  if (*prVar1 == 0xfffffffffffffffe) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"reference counter overflow");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  return;
}

Assistant:

inline void take_reference(void) const
  {
    refcount_t * refcount = refcount_addr();
    *refcount += 1;
    if (*refcount == REFCOUNT_MAX) // overflow
      throw std::overflow_error("reference counter overflow");
  }